

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O2

bool __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::CheckBuffer
          (BlendMaskStateMachine *this,int idx)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  pointer pBVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  MessageBuilder *pMVar11;
  GLboolean ba [4];
  GLint ia [4];
  GLfloat fa [4];
  GLint64 lia [4];
  byte local_200;
  byte local_1ff;
  byte local_1fe;
  byte local_1fd;
  byte local_1fc;
  byte local_1fb;
  byte local_1fa;
  byte local_1f9;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  uint local_1d8 [2];
  uint local_1d0;
  uint local_1c8;
  uint local_1c0;
  undefined1 local_1b0 [384];
  
  bVar7 = (*this->gl->isEnabledi)(0xbe2,idx);
  pBVar6 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pBVar6[idx].enable != (uint)bVar7) {
    local_1b0._0_8_ = this->testLog;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Blending for buffer #");
    std::ostream::operator<<(poVar2,idx);
    std::operator<<((ostream *)poVar2," set to: ");
    std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<((ostream *)poVar2," but should be ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,
                         &(this->state).
                          super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                          ._M_impl.super__Vector_impl_data._M_start[idx].enable);
    std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"!");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_00d499e7;
  }
  local_1f9 = CheckEnumForBuffer(this,idx,0x8009,pBVar6[idx].mode_rgb);
  local_1fa = CheckEnumForBuffer(this,idx,0x883d,
                                 (this->state).
                                 super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                 ._M_impl.super__Vector_impl_data._M_start[idx].mode_a);
  local_1fb = CheckEnumForBuffer(this,idx,0x80c9,
                                 (this->state).
                                 super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                 ._M_impl.super__Vector_impl_data._M_start[idx].func_src_rgb);
  bVar8 = CheckEnumForBuffer(this,idx,0x80cb,
                             (this->state).
                             super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                             ._M_impl.super__Vector_impl_data._M_start[idx].func_src_a);
  local_1fc = CheckEnumForBuffer(this,idx,0x80c8,
                                 (this->state).
                                 super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                 ._M_impl.super__Vector_impl_data._M_start[idx].func_dst_rgb);
  bVar9 = CheckEnumForBuffer(this,idx,0x80ca,
                             (this->state).
                             super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                             ._M_impl.super__Vector_impl_data._M_start[idx].func_dst_a);
  (*this->gl->getIntegeri_v)(0xc23,idx,(GLint *)&local_1f8);
  (*this->gl->getInteger64i_v)(0xc23,idx,(GLint64 *)local_1d8);
  (*this->gl->getBooleani_v)(0xc23,idx,&local_200);
  pBVar6 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar7 = pBVar6[idx].mask_r;
  if (((local_1f8 == bVar7) && (local_1d8[0] == bVar7)) && (local_200 == bVar7)) {
    bVar7 = pBVar6[idx].mask_g;
    if (((local_1f4 != bVar7) || (local_1d0 != bVar7)) || (local_1ff != bVar7)) goto LAB_00d492ca;
    bVar7 = pBVar6[idx].mask_b;
    if (((local_1f0 != bVar7) || (local_1c8 != bVar7)) || (local_1fe != bVar7)) goto LAB_00d492ca;
    bVar7 = pBVar6[idx].mask_a;
    if (((local_1ec != bVar7) || (local_1c0 != bVar7)) || (local_1fd != bVar7)) goto LAB_00d492ca;
    bVar8 = (bool)(bVar8 & local_1fc & bVar9 & local_1f9 & local_1fa & local_1fb);
  }
  else {
LAB_00d492ca:
    local_1b0._0_8_ = this->testLog;
    poVar2 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"GL_COLOR_WRITEMASK for buffer #");
    std::ostream::operator<<(poVar2,idx);
    std::operator<<((ostream *)poVar2," should be set to(");
    pMVar11 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,
                         &(this->state).
                          super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                          ._M_impl.super__Vector_impl_data._M_start[idx].mask_r);
    std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,&(this->state).
                                  super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                  ._M_impl.super__Vector_impl_data._M_start[idx].mask_g);
    std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,&(this->state).
                                  super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                  ._M_impl.super__Vector_impl_data._M_start[idx].mask_b);
    std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
    pMVar11 = tcu::MessageBuilder::operator<<
                        (pMVar11,&(this->state).
                                  super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                  ._M_impl.super__Vector_impl_data._M_start[idx].mask_a);
    poVar1 = &pMVar11->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,")\n");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    "but the following values was set:\n");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"int: ");
    std::ostream::operator<<(poVar1,local_1f8);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    std::ostream::operator<<(poVar1,local_1f4);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    std::ostream::operator<<(poVar1,local_1f0);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    std::ostream::operator<<(poVar1,local_1ec);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"int64: ");
    std::ostream::_M_insert<long>((long)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    std::ostream::_M_insert<long>((long)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    std::ostream::_M_insert<long>((long)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    std::ostream::_M_insert<long>((long)poVar1);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"bool: ");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,local_200);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,local_1ff);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,local_1fe);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,local_1fd);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    bVar8 = false;
  }
  if (idx != 0) {
    return bVar8;
  }
  local_1f9 = CheckEnumGeneral(this,0x8009,
                               ((this->state).
                                super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                ._M_impl.super__Vector_impl_data._M_start)->mode_rgb);
  local_1fa = bVar8 != false;
  local_1fb = CheckEnumGeneral(this,0x883d,
                               (this->state).
                               super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                               ._M_impl.super__Vector_impl_data._M_start[idx].mode_a);
  local_1fc = CheckEnumGeneral(this,0x80c9,
                               (this->state).
                               super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                               ._M_impl.super__Vector_impl_data._M_start[idx].func_src_rgb);
  bVar8 = CheckEnumGeneral(this,0x80cb,
                           (this->state).
                           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                           ._M_impl.super__Vector_impl_data._M_start[idx].func_src_a);
  bVar9 = CheckEnumGeneral(this,0x80c8,
                           (this->state).
                           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                           ._M_impl.super__Vector_impl_data._M_start[idx].func_dst_rgb);
  bVar10 = CheckEnumGeneral(this,0x80ca,
                            (this->state).
                            super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                            ._M_impl.super__Vector_impl_data._M_start[idx].func_dst_a);
  (*this->gl->getIntegerv)(0xc23,(GLint *)&local_1f8);
  (*this->gl->getInteger64v)(0xc23,(GLint64 *)local_1d8);
  (*this->gl->getBooleanv)(0xc23,&local_200);
  (*this->gl->getFloatv)(0xc23,&local_1e8);
  pBVar6 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar7 = pBVar6[idx].mask_r;
  if ((local_1f8 == bVar7) && (local_1d8[0] == bVar7)) {
    bVar3 = pBVar6[idx].mask_g;
    if ((local_1f4 == bVar3) && (local_1d0 == bVar3)) {
      bVar4 = pBVar6[idx].mask_b;
      if ((local_1f0 == bVar4) && (local_1c8 == bVar4)) {
        bVar5 = pBVar6[idx].mask_a;
        if ((local_1ec == bVar5) &&
           ((((((local_1c0 == bVar5 && (local_200 == bVar7)) && (local_1f8 == (int)local_1e8)) &&
              ((local_1ff == bVar3 && (local_1f4 == (int)local_1e4)))) &&
             ((local_1fe == bVar4 && ((local_1f0 == (int)local_1e0 && (local_1fd == bVar5)))))) &&
            (local_1ec == (int)local_1dc)))) {
          return (bool)(local_1f9 & local_1fb & local_1fc & bVar8 & bVar9 & bVar10 & local_1fa);
        }
      }
    }
  }
  local_1b0._0_8_ = this->testLog;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"GL_COLOR_WRITEMASK for buffer #");
  std::ostream::operator<<(poVar2,0);
  std::operator<<((ostream *)poVar2," should be set to(");
  pMVar11 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,
                       &(this->state).
                        super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                        ._M_impl.super__Vector_impl_data._M_start[idx].mask_r);
  std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar11 = tcu::MessageBuilder::operator<<
                      (pMVar11,&(this->state).
                                super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                ._M_impl.super__Vector_impl_data._M_start[idx].mask_g);
  std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar11 = tcu::MessageBuilder::operator<<
                      (pMVar11,&(this->state).
                                super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                ._M_impl.super__Vector_impl_data._M_start[idx].mask_b);
  std::operator<<(&(pMVar11->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar11 = tcu::MessageBuilder::operator<<
                      (pMVar11,&(this->state).
                                super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
                                ._M_impl.super__Vector_impl_data._M_start[idx].mask_a);
  poVar1 = &pMVar11->m_str;
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,")\n");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                  "but the following values was set:\n");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"int: ");
  std::ostream::operator<<(poVar1,local_1f8);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  std::ostream::operator<<(poVar1,local_1f4);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  std::ostream::operator<<(poVar1,local_1f0);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  std::ostream::operator<<(poVar1,local_1ec);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"int64: ");
  std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"bool: ");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,local_200);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,local_1ff);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,local_1fe);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,local_1fd);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"float: ");
  std::ostream::operator<<(poVar1,local_1e8);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  std::ostream::operator<<(poVar1,local_1e4);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  std::ostream::operator<<(poVar1,local_1e0);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  std::ostream::operator<<(poVar1,local_1dc);
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00d499e7:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  return false;
}

Assistant:

bool DrawBuffersIndexedBase::BlendMaskStateMachine::CheckBuffer(int idx)
{
	if (gl.isEnabledi(GL_BLEND, idx) != state[idx].enable)
	{
		testLog << tcu::TestLog::Message << "Blending for buffer #" << idx << " set to: " << !state[idx].enable
				<< " but should be " << state[idx].enable << "!" << tcu::TestLog::EndMessage;
		return false;
	}

	bool result = true;

	result &= CheckEnumForBuffer(idx, GL_BLEND_EQUATION_RGB, state[idx].mode_rgb);
	result &= CheckEnumForBuffer(idx, GL_BLEND_EQUATION_ALPHA, state[idx].mode_a);
	result &= CheckEnumForBuffer(idx, GL_BLEND_SRC_RGB, state[idx].func_src_rgb);
	result &= CheckEnumForBuffer(idx, GL_BLEND_SRC_ALPHA, state[idx].func_src_a);
	result &= CheckEnumForBuffer(idx, GL_BLEND_DST_RGB, state[idx].func_dst_rgb);
	result &= CheckEnumForBuffer(idx, GL_BLEND_DST_ALPHA, state[idx].func_dst_a);

	glw::GLint	 ia[4];
	glw::GLint64   lia[4];
	glw::GLboolean ba[4];

	gl.getIntegeri_v(GL_COLOR_WRITEMASK, idx, ia);
	gl.getInteger64i_v(GL_COLOR_WRITEMASK, idx, lia);
	gl.getBooleani_v(GL_COLOR_WRITEMASK, idx, ba);
	if ((ia[0] != state[idx].mask_r) || (static_cast<int>(lia[0]) != state[idx].mask_r) ||
		(static_cast<int>(ba[0]) != state[idx].mask_r) || (ia[1] != state[idx].mask_g) ||
		(static_cast<int>(lia[1]) != state[idx].mask_g) || (static_cast<int>(ba[1]) != state[idx].mask_g) ||
		(ia[2] != state[idx].mask_b) || (static_cast<int>(lia[2]) != state[idx].mask_b) ||
		(static_cast<int>(ba[2]) != state[idx].mask_b) || (ia[3] != state[idx].mask_a) ||
		(static_cast<int>(lia[3]) != state[idx].mask_a) || (static_cast<int>(ba[3]) != state[idx].mask_a))
	{
		testLog << tcu::TestLog::Message << "GL_COLOR_WRITEMASK for buffer #" << idx << " should be set to("
				<< state[idx].mask_r << ", " << state[idx].mask_g << ", " << state[idx].mask_b << ", "
				<< state[idx].mask_a << ")\n"
				<< "but the following values was set:\n"
				<< "int: " << ia[0] << ", " << ia[1] << ", " << ia[2] << ", " << ia[3] << "\n"
				<< "int64: " << lia[0] << ", " << lia[1] << ", " << lia[2] << ", " << lia[3] << "\n"
				<< "bool: " << ba[0] << ", " << ba[1] << ", " << ba[2] << ", " << ba[3] << tcu::TestLog::EndMessage;
		result = false;
	}
	if (idx == 0)
	{
		result &= CheckEnumGeneral(GL_BLEND_EQUATION_RGB, state[idx].mode_rgb);
		result &= CheckEnumGeneral(GL_BLEND_EQUATION_ALPHA, state[idx].mode_a);
		result &= CheckEnumGeneral(GL_BLEND_SRC_RGB, state[idx].func_src_rgb);
		result &= CheckEnumGeneral(GL_BLEND_SRC_ALPHA, state[idx].func_src_a);
		result &= CheckEnumGeneral(GL_BLEND_DST_RGB, state[idx].func_dst_rgb);
		result &= CheckEnumGeneral(GL_BLEND_DST_ALPHA, state[idx].func_dst_a);

		glw::GLfloat fa[4];

		gl.getIntegerv(GL_COLOR_WRITEMASK, ia);
		gl.getInteger64v(GL_COLOR_WRITEMASK, lia);
		gl.getBooleanv(GL_COLOR_WRITEMASK, ba);
		gl.getFloatv(GL_COLOR_WRITEMASK, fa);
		if ((ia[0] != state[idx].mask_r) || (static_cast<int>(lia[0]) != state[idx].mask_r) ||
			(ia[1] != state[idx].mask_g) || (static_cast<int>(lia[1]) != state[idx].mask_g) ||
			(ia[2] != state[idx].mask_b) || (static_cast<int>(lia[2]) != state[idx].mask_b) ||
			(ia[3] != state[idx].mask_a) || (static_cast<int>(lia[3]) != state[idx].mask_a) ||
			(static_cast<int>(ba[0]) != state[idx].mask_r) || (static_cast<int>(fa[0]) != state[idx].mask_r) ||
			(static_cast<int>(ba[1]) != state[idx].mask_g) || (static_cast<int>(fa[1]) != state[idx].mask_g) ||
			(static_cast<int>(ba[2]) != state[idx].mask_b) || (static_cast<int>(fa[2]) != state[idx].mask_b) ||
			(static_cast<int>(ba[3]) != state[idx].mask_a) || (static_cast<int>(fa[3]) != state[idx].mask_a))
		{
			testLog << tcu::TestLog::Message << "GL_COLOR_WRITEMASK for buffer #" << idx << " should be set to("
					<< state[idx].mask_r << ", " << state[idx].mask_g << ", " << state[idx].mask_b << ", "
					<< state[idx].mask_a << ")\n"
					<< "but the following values was set:\n"
					<< "int: " << ia[0] << ", " << ia[1] << ", " << ia[2] << ", " << ia[3] << "\n"
					<< "int64: " << lia[0] << ", " << lia[1] << ", " << lia[2] << ", " << lia[3] << "\n"
					<< "bool: " << ba[0] << ", " << ba[1] << ", " << ba[2] << ", " << ba[3] << "\n"
					<< "float: " << fa[0] << ", " << fa[1] << ", " << fa[2] << ", " << fa[3]
					<< tcu::TestLog::EndMessage;
			result = false;
		}
	}
	return result;
}